

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *p)

{
  FieldGeneratorTable *this_00;
  Options *options;
  Descriptor *desc;
  long *plVar1;
  pointer pSVar2;
  int **ppiVar3;
  Printer *pPVar4;
  bool bVar5;
  FileOptions_OptimizeMode FVar6;
  value_type_conflict field;
  FieldGenerator *this_01;
  undefined1 split;
  MessageGenerator *pMVar7;
  long lVar8;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Span<const_google::protobuf::io::Printer::Sub> vars_02;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t_1;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v_1;
  Iterator __begin3;
  Iterator __end3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *local_700;
  int **local_6f8;
  MessageGenerator *local_6f0;
  undefined1 local_6e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  _Alloc_hider local_6b8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> _Stack_6b0;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_6a8;
  size_type local_6a0;
  __index_type local_698;
  undefined7 uStack_697;
  undefined8 uStack_690;
  pointer local_688;
  pointer local_680;
  undefined1 local_678 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  undefined1 local_658 [32];
  undefined1 local_638 [24];
  undefined1 local_620 [16];
  _Alloc_hider _Stack_610;
  undefined1 local_608 [16];
  int local_5f8 [4];
  undefined1 local_5e8 [32];
  string local_5c8 [16];
  undefined1 local_5b8 [16];
  pointer local_5a8;
  size_type local_5a0;
  undefined1 local_598;
  undefined7 uStack_597;
  long lStack_590;
  pointer local_588;
  pointer local_580;
  undefined1 local_578;
  undefined7 uStack_577;
  undefined8 uStack_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> _Stack_550;
  undefined1 local_548 [24];
  undefined1 auStack_530 [8];
  string local_528;
  string local_508;
  undefined1 local_4e8 [17];
  undefined7 uStack_4d7;
  undefined8 uStack_4d0;
  undefined1 local_4c8 [24];
  code *local_4b0;
  byte local_4a8;
  _Alloc_hider local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  bool local_480;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_478;
  undefined1 local_430 [56];
  code *local_3f8;
  __index_type local_3f0;
  _Alloc_hider local_3e8;
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  bool local_3c8;
  bool local_380;
  _Alloc_hider *local_378;
  undefined8 local_370;
  _Alloc_hider local_368;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> _Stack_360;
  undefined8 *local_358;
  undefined8 local_350;
  code *local_348;
  code *local_340;
  undefined1 local_338;
  undefined1 *local_330;
  undefined8 local_328;
  undefined1 local_320 [16];
  undefined1 local_310;
  undefined1 local_2c8;
  int **local_2c0;
  pointer local_2b8;
  int *local_2b0;
  _Alloc_hider _Stack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  code *local_290;
  code *local_288;
  undefined1 local_280;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268 [16];
  undefined1 local_258;
  undefined1 local_210;
  int *local_208;
  undefined8 local_200;
  int local_1f8 [2];
  _Alloc_hider _Stack_1f0;
  undefined8 *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  undefined1 local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0;
  undefined1 local_158;
  Iterator local_150;
  Iterator local_140;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_130;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_118;
  Options local_100;
  
  options = &this->options_;
  local_700 = p;
  bVar5 = ShouldGenerateClass(this->descriptor_,options);
  if (bVar5) {
    desc = this->descriptor_;
    Options::Options(&local_100,options);
    anon_unknown_0::ClassVars
              ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)local_4e8,desc,&local_100);
    vars.len_ = ((long)(local_4e8._8_8_ - local_4e8._0_8_) >> 3) * -0x2c8590b21642c859;
    vars.ptr_ = (pointer)local_4e8._0_8_;
    io::Printer::WithDefs(&local_118,p,vars,false);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)local_4e8);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set(&local_100.field_listener_options.forbidden_field_listener_events.
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.annotation_guard_name._M_dataplus._M_p !=
        &local_100.annotation_guard_name.field_2) {
      operator_delete(local_100.annotation_guard_name._M_dataplus._M_p,
                      local_100.annotation_guard_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.annotation_pragma_name._M_dataplus._M_p !=
        &local_100.annotation_pragma_name.field_2) {
      operator_delete(local_100.annotation_pragma_name._M_dataplus._M_p,
                      local_100.annotation_pragma_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.runtime_include_base._M_dataplus._M_p !=
        &local_100.runtime_include_base.field_2) {
      operator_delete(local_100.runtime_include_base._M_dataplus._M_p,
                      local_100.runtime_include_base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.dllexport_decl._M_dataplus._M_p != &local_100.dllexport_decl.field_2) {
      operator_delete(local_100.dllexport_decl._M_dataplus._M_p,
                      local_100.dllexport_decl.field_2._M_allocated_capacity + 1);
    }
    pPVar4 = local_700;
    MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_4e8,this->descriptor_,options);
    vars_00.len_ = ((long)(local_4e8._8_8_ - local_4e8._0_8_) >> 3) * -0x2c8590b21642c859;
    vars_00.ptr_ = (pointer)local_4e8._0_8_;
    io::Printer::WithDefs(&local_130,pPVar4,vars_00,false);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)local_4e8);
    pPVar4 = local_700;
    local_6f0 = this;
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) == '\x01') {
      pSVar2 = (pointer)(local_620 + 8);
      local_638._16_8_ = pSVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_638 + 0x10),"annotate_accessors","");
      local_4e8._0_8_ = local_4e8 + 0x10;
      if ((pointer)local_638._16_8_ == pSVar2) {
        uStack_4d0 = _Stack_610._M_p;
      }
      else {
        local_4e8._0_8_ = local_638._16_8_;
      }
      local_4e8._8_8_ = local_620._0_8_;
      local_620._0_8_ = (pointer)0x0;
      local_620[8] = '\0';
      local_638._16_8_ = pSVar2;
      local_4c8._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_4c8._0_8_ = local_6f0;
      *(Printer ***)(local_4c8._0_8_ + 8) = &local_700;
      *(undefined1 *)(local_4c8._0_8_ + 0x10) = 0;
      local_4b0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_4c8._8_8_ = 0;
      local_4c8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_4a8 = '\x01';
      local_4a0._M_p = (pointer)&local_490;
      local_498 = 0;
      local_490._M_local_buf[0] = '\0';
      local_480 = false;
      std::__cxx11::string::_M_replace((ulong)&local_4a0,0,(char *)0x0,0x361ff2);
      local_478._M_engaged = false;
      local_658._16_8_ = local_638;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)local_658 + 0x10),"verify","");
      local_430._0_8_ = local_430 + 0x10;
      if ((undefined1 *)local_658._16_8_ == local_638) {
        local_430._24_8_ = local_638._8_8_;
      }
      else {
        local_430._0_8_ = local_658._16_8_;
      }
      local_430._8_8_ = local_658._24_8_;
      local_658._24_8_ = 0;
      local_638[0] = '\0';
      local_658._16_8_ = local_638;
      local_430._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_430._32_8_ = local_6f0;
      *(Printer ***)(local_430._32_8_ + 8) = &local_700;
      *(undefined1 *)(local_430._32_8_ + 0x10) = 0;
      local_3f8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_430._40_8_ = 0;
      local_430._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_3f0 = '\x01';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = 0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_3e8,0,(char *)0x0,0x361ff2);
      local_380 = false;
      local_568._M_allocated_capacity = (size_type)&local_558;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"class_data","");
      local_378 = &local_368;
      if ((_Alloc_hider *)local_568._M_allocated_capacity == &local_558) {
        _Stack_360 = _Stack_550;
      }
      else {
        local_378 = (_Alloc_hider *)local_568._M_allocated_capacity;
      }
      local_370 = local_568._8_8_;
      local_568._8_8_ = 0;
      local_558._M_p._0_1_ = 0;
      local_568._M_allocated_capacity = (size_type)&local_558;
      local_358 = (undefined8 *)operator_new(0x18);
      *local_358 = local_6f0;
      local_358[1] = &local_700;
      *(undefined1 *)(local_358 + 2) = 0;
      local_340 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_350 = 0;
      local_348 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_338 = 1;
      local_330 = local_320;
      local_328 = 0;
      local_320[0] = 0;
      local_310 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_330,0,(char *)0x0,0x361ff2);
      local_2c8 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar4,local_4e8,3,0x22d,
                 "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n              $classname$::$classname$() : SuperType(_class_data_.base()) {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena)\n                  : SuperType(arena, _class_data_.base()) {}\n#else   // PROTOBUF_CUSTOM_VTABLE\n              $classname$::$classname$() : SuperType() {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              $annotate_accessors$;\n              $verify$;\n              $class_data$;\n            "
                );
      lVar8 = 0x228;
      do {
        if (local_4e8[lVar8 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (auStack_530 + lVar8));
        }
        plVar1 = *(long **)((long)&local_558._M_p + lVar8);
        if ((long *)(local_548 + lVar8) != plVar1) {
          operator_delete(plVar1,*(long *)(local_548 + lVar8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)(&local_578)[lVar8 + 0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&local_580 + lVar8));
        (&local_578)[lVar8 + 0x18] = 0xff;
        if ((long *)((long)&local_5a8 + lVar8 + 0x18) != *(long **)((long)&local_5a8 + lVar8 + 8)) {
          operator_delete(*(long **)((long)&local_5a8 + lVar8 + 8),
                          *(long *)((long)&local_5a8 + lVar8 + 0x18) + 1);
        }
        lVar8 = lVar8 + -0xb8;
      } while (lVar8 != 0);
      if ((_Alloc_hider *)local_568._M_allocated_capacity != &local_558) {
        operator_delete((void *)local_568._M_allocated_capacity,
                        CONCAT71(local_558._M_p._1_7_,local_558._M_p._0_1_) + 1);
      }
      pMVar7 = local_6f0;
      if ((undefined1 *)local_658._16_8_ != local_638) {
        operator_delete((void *)local_658._16_8_,CONCAT71(local_638._1_7_,local_638[0]) + 1);
      }
      if ((pointer)local_638._16_8_ != (pointer)(local_620 + 8)) {
        operator_delete((void *)local_638._16_8_,CONCAT71(local_620._9_7_,local_620[8]) + 1);
      }
      ParseFunctionGenerator::GenerateDataDefinitions
                ((pMVar7->parse_function_generator_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                 ._M_head_impl,local_700);
    }
    else {
      bVar5 = IsAnyMessage(this->descriptor_);
      pPVar4 = local_700;
      if (bVar5) {
        local_588 = (pointer)&local_578;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_588,"any_field_descriptor","");
        local_4e8._0_8_ = local_4e8 + 0x10;
        if (local_588 == (pointer)&local_578) {
          uStack_4d0 = uStack_570;
        }
        else {
          local_4e8._0_8_ = local_588;
        }
        uStack_4d7 = uStack_577;
        local_4e8[0x10] = local_578;
        local_4e8._8_8_ = local_580;
        local_580 = (pointer)0x0;
        local_578 = 0;
        local_588 = (pointer)&local_578;
        local_4c8._0_8_ = operator_new(0x18);
        *(MessageGenerator **)local_4c8._0_8_ = local_6f0;
        *(Printer ***)(local_4c8._0_8_ + 8) = &local_700;
        *(undefined1 *)(local_4c8._0_8_ + 0x10) = 0;
        local_4b0 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
        local_4c8._8_8_ = 0;
        local_4c8._16_8_ =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
        local_4a8 = 1;
        local_498 = 0;
        local_490._M_local_buf[0] = '\0';
        local_480 = false;
        local_4a0._M_p = (pointer)&local_490;
        std::__cxx11::string::_M_replace((ulong)&local_4a0,0,(char *)0x0,0x361ff2);
        local_478._M_engaged = false;
        google::protobuf::io::Printer::Emit
                  (pPVar4,local_4e8,1,0x12a,
                   "\n              $any_field_descriptor$;\n              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,\n                                                std::string* full_type_name) {\n                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);\n              }\n            "
                  );
        if (local_478._M_engaged == true) {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    (&local_478);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_p != &local_490) {
          operator_delete(local_4a0._M_p,
                          CONCAT71(local_490._M_allocated_capacity._1_7_,local_490._M_local_buf[0])
                          + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[local_4a8]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_4e8 + 0x20));
        local_4a8 = 0xff;
        if ((pointer)local_4e8._0_8_ != (pointer)(local_4e8 + 0x10)) {
          operator_delete((void *)local_4e8._0_8_,(ulong)(stack0xfffffffffffffb28 + 1));
        }
        if (local_588 != (pointer)&local_578) {
          operator_delete(local_588,CONCAT71(uStack_577,local_578) + 1);
        }
      }
      pPVar4 = local_700;
      pSVar2 = (pointer)(local_678 + 0x20);
      local_668._M_allocated_capacity = (size_type)pSVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_678 + 0x10),"has_bit","");
      local_4e8._0_8_ = local_4e8 + 0x10;
      if ((pointer)local_668._M_allocated_capacity == pSVar2) {
        uStack_4d0 = local_658._8_8_;
      }
      else {
        local_4e8._0_8_ = local_668._M_allocated_capacity;
      }
      local_4e8._8_8_ = local_668._8_8_;
      local_668._8_8_ = (pointer)0x0;
      local_658[0] = '\0';
      local_668._M_allocated_capacity = (size_type)pSVar2;
      local_4c8._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_4c8._0_8_ = local_6f0;
      *(Printer ***)(local_4c8._0_8_ + 8) = &local_700;
      *(undefined1 *)(local_4c8._0_8_ + 0x10) = 0;
      local_4b0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_4c8._8_8_ = 0;
      local_4c8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_4a8 = '\x01';
      local_4a0._M_p = (pointer)&local_490;
      local_498 = 0;
      local_490._M_local_buf[0] = '\0';
      local_480 = false;
      std::__cxx11::string::_M_replace((ulong)&local_4a0,0,(char *)0x0,0x361ff2);
      local_478._M_engaged = false;
      local_5a8 = &local_598;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"oneof","");
      local_430._0_8_ = local_430 + 0x10;
      if (local_5a8 == &local_598) {
        local_430._24_8_ = lStack_590;
      }
      else {
        local_430._0_8_ = local_5a8;
      }
      local_430._8_8_ = local_5a0;
      local_5a0 = 0;
      local_598 = 0;
      local_5a8 = &local_598;
      local_430._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_430._32_8_ = local_6f0;
      *(Printer ***)(local_430._32_8_ + 8) = &local_700;
      *(undefined1 *)(local_430._32_8_ + 0x10) = 0;
      local_3f8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_430._40_8_ = 0;
      local_430._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_3f0 = '\x01';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = 0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_3e8,0,(char *)0x0,0x361ff2);
      local_380 = false;
      local_5c8._0_8_ = local_5b8;
      std::__cxx11::string::_M_construct<char_const*>(local_5c8,"required","");
      local_378 = &local_368;
      if ((undefined1 *)local_5c8._0_8_ == local_5b8) {
        _Stack_360._M_payload =
             (_Storage<google::protobuf::io::AnnotationCollector::Semantic,_true>)local_5b8._8_4_;
        _Stack_360._M_engaged = (bool)local_5b8[0xc];
        _Stack_360._5_3_ = local_5b8._13_3_;
      }
      else {
        local_378 = (_Alloc_hider *)local_5c8._0_8_;
      }
      local_370._0_1_ = local_5c8[8];
      local_370._1_1_ = local_5c8[9];
      local_370._2_1_ = local_5c8[10];
      local_370._3_1_ = local_5c8[0xb];
      local_370._4_1_ = local_5c8[0xc];
      local_370._5_1_ = local_5c8[0xd];
      local_370._6_1_ = local_5c8[0xe];
      local_370._7_1_ = local_5c8[0xf];
      local_5c8[8] = (string)0x0;
      local_5c8[9] = (string)0x0;
      local_5c8[10] = (string)0x0;
      local_5c8[0xb] = (string)0x0;
      local_5c8[0xc] = (string)0x0;
      local_5c8[0xd] = (string)0x0;
      local_5c8[0xe] = (string)0x0;
      local_5c8[0xf] = (string)0x0;
      local_5b8[0] = 0;
      local_5c8._0_8_ = local_5b8;
      local_358 = (undefined8 *)operator_new(0x18);
      *local_358 = local_6f0;
      local_358[1] = &local_700;
      *(undefined1 *)(local_358 + 2) = 0;
      local_340 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_350 = 0;
      local_348 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_338 = 1;
      local_330 = local_320;
      local_328 = 0;
      local_320[0] = 0;
      local_310 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_330,0,(char *)0x0,0x361ff2);
      local_2c8 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar4,local_4e8,3,0x88,
                 "\n        class $classname$::_Internal {\n         public:\n          $has_bit$;\n          $oneof$;\n          $required$;\n        };\n      "
                );
      lVar8 = 0x228;
      do {
        if (local_4e8[lVar8 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (auStack_530 + lVar8));
        }
        plVar1 = *(long **)((long)&local_558._M_p + lVar8);
        if ((long *)(local_548 + lVar8) != plVar1) {
          operator_delete(plVar1,*(long *)(local_548 + lVar8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)(&local_578)[lVar8 + 0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&local_580 + lVar8));
        (&local_578)[lVar8 + 0x18] = 0xff;
        if ((long *)((long)&local_5a8 + lVar8 + 0x18) != *(long **)((long)&local_5a8 + lVar8 + 8)) {
          operator_delete(*(long **)((long)&local_5a8 + lVar8 + 8),
                          *(long *)((long)&local_5a8 + lVar8 + 0x18) + 1);
        }
        lVar8 = lVar8 + -0xb8;
      } while (lVar8 != 0);
      if ((undefined1 *)local_5c8._0_8_ != local_5b8) {
        operator_delete((void *)local_5c8._0_8_,CONCAT71(local_5b8._1_7_,local_5b8[0]) + 1);
      }
      pMVar7 = local_6f0;
      if (local_5a8 != &local_598) {
        operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
      }
      if ((pointer)local_668._M_allocated_capacity != (pointer)(local_678 + 0x20)) {
        operator_delete((void *)local_668._M_allocated_capacity,
                        CONCAT71(local_658._1_7_,local_658[0]) + 1);
      }
      google::protobuf::io::Printer::Emit(local_700,0,0,1);
      local_150.descriptor = pMVar7->descriptor_;
      local_150.idx = 0;
      local_140.idx = *(int *)(local_150.descriptor + 4);
      this_00 = &pMVar7->field_generators_;
      local_6f8 = (int **)local_4e8;
      local_140.descriptor = local_150.descriptor;
      while( true ) {
        bVar5 = protobuf::internal::operator==(&local_150,&local_140);
        if (bVar5) break;
        field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                operator*(&local_150);
        pPVar4 = local_700;
        FieldVars((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)local_6e8,field,options);
        vars_01.len_ = ((long)(local_6e8._8_8_ - local_6e8._0_8_) >> 3) * -0x2c8590b21642c859;
        vars_01.ptr_ = (pointer)local_6e8._0_8_;
        io::Printer::WithDefs
                  ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_4e8,pPVar4,vars_01,false);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)local_6e8);
        pPVar4 = local_700;
        MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          *)local_548,field,options);
        vars_02.len_ = ((long)(local_548._8_8_ - local_548._0_8_) >> 3) * -0x2c8590b21642c859;
        vars_02.ptr_ = (pointer)local_548._0_8_;
        io::Printer::WithDefs
                  ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_6e8,pPVar4,vars_02,false);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)local_548);
        this_01 = FieldGeneratorTable::get(this_00,field);
        pMVar7 = local_6f0;
        FieldGenerator::GenerateNonInlineAccessorDefinitions(this_01,local_700);
        bVar5 = anon_unknown_0::IsCrossFileMaybeMap(field);
        if (bVar5) {
          GenerateFieldClear(pMVar7,field,false,local_700);
        }
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_6e8);
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_4e8);
        local_150.idx = local_150.idx + 1;
      }
      GenerateStructors(pMVar7,local_700);
      split = 0x8f;
      google::protobuf::io::Printer::Emit(local_700,0,0,1);
      if (0 < *(int *)(pMVar7->descriptor_ + 0x7c)) {
        GenerateOneofClear(pMVar7,local_700);
        split = 0x8f;
        google::protobuf::io::Printer::Emit(local_700,0,0,1);
      }
      GenerateClassData(pMVar7,local_700);
      ParseFunctionGenerator::GenerateDataDefinitions
                ((pMVar7->parse_function_generator_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                 ._M_head_impl,local_700);
      FVar6 = GetOptimizeFor(*(FileDescriptor **)(pMVar7->descriptor_ + 0x10),options,(bool *)0x0);
      if (FVar6 != FileOptions_OptimizeMode_CODE_SIZE) {
        GenerateClear(pMVar7,local_700);
        google::protobuf::io::Printer::Emit(local_700,0,0,1,"\n");
        GenerateSerializeWithCachedSizesToArray(pMVar7,local_700);
        google::protobuf::io::Printer::Emit(local_700,0,0,1,"\n");
        GenerateByteSize(pMVar7,local_700);
        google::protobuf::io::Printer::Emit(local_700,0,0,1,"\n");
        GenerateClassSpecificMergeImpl(pMVar7,local_700);
        google::protobuf::io::Printer::Emit(local_700,0,0,1,"\n");
        GenerateCopyFrom(pMVar7,local_700);
        google::protobuf::io::Printer::Emit(local_700,0,0,1,"\n");
        GenerateIsInitialized(pMVar7,local_700);
        split = 0x8f;
        google::protobuf::io::Printer::Emit(local_700,0,0,1);
      }
      bVar5 = ShouldSplit(pMVar7->descriptor_,options);
      pPVar4 = local_700;
      if (bVar5) {
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"split_default","");
        DefaultInstanceName_abi_cxx11_
                  ((string *)local_6e8,(cpp *)pMVar7->descriptor_,(Descriptor *)options,
                   (Options *)0x1,(bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>
                  ((Sub *)local_4e8,&local_508,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8);
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_530 + 8),"default","");
        DefaultInstanceName_abi_cxx11_
                  ((string *)local_548,(cpp *)pMVar7->descriptor_,(Descriptor *)options,
                   (Options *)0x0,(bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>
                  ((Sub *)local_430,(string *)(auStack_530 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
        google::protobuf::io::Printer::Emit
                  (pPVar4,local_4e8,2,0x1ae,
                   "\n              void $classname$::PrepareSplitMessageForWrite() {\n                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {\n                  void* chunk = $pbi$::CreateSplitMessageGeneric(\n                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,\n                      &$default$);\n                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);\n                }\n              }\n            "
                  );
        lVar8 = 0x170;
        do {
          if (local_4e8[lVar8 + -8] == '\x01') {
            std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                      ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                       (auStack_530 + lVar8));
          }
          plVar1 = *(long **)((long)&local_558._M_p + lVar8);
          if ((long *)(local_548 + lVar8) != plVar1) {
            operator_delete(plVar1,*(long *)(local_548 + lVar8) + 1);
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
            ::_S_vtable._M_arr[(byte)(&local_578)[lVar8 + 0x18]]._M_data)
                    ((anon_class_1_0_00000001 *)&local_150,
                     (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                      *)((long)&local_580 + lVar8));
          (&local_578)[lVar8 + 0x18] = 0xff;
          if ((long *)((long)&local_5a8 + lVar8 + 0x18) != *(long **)((long)&local_5a8 + lVar8 + 8))
          {
            operator_delete(*(long **)((long)&local_5a8 + lVar8 + 8),
                            *(long *)((long)&local_5a8 + lVar8 + 0x18) + 1);
          }
          lVar8 = lVar8 + -0xb8;
        } while (lVar8 != 0);
        if ((pointer)local_548._0_8_ != (pointer)(local_548 + 0x10)) {
          operator_delete((void *)local_548._0_8_,(ulong)(local_548._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._0_8_ + 1);
        }
        if ((pointer)local_6e8._0_8_ != (pointer)(local_6e8 + 0x10)) {
          operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
      }
      GenerateSwap(pMVar7,local_700);
      google::protobuf::io::Printer::Emit(local_700,0,0,1,"\n");
      pPVar4 = local_700;
      local_688 = (pointer)local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_688,"annotate_accessor_definition","");
      local_4e8._0_8_ = local_4e8 + 0x10;
      if (local_688 == (pointer)local_678) {
        uStack_4d0 = local_678._8_8_;
      }
      else {
        local_4e8._0_8_ = local_688;
      }
      local_4e8._8_8_ = local_680;
      local_680 = (pointer)0x0;
      local_678[0] = 0;
      local_688 = (pointer)local_678;
      local_4c8._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_4c8._0_8_ = pMVar7;
      *(Printer ***)(local_4c8._0_8_ + 8) = &local_700;
      *(undefined1 *)(local_4c8._0_8_ + 0x10) = 0;
      local_4b0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_4c8._8_8_ = 0;
      local_4c8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_4a8 = '\x01';
      local_4a0._M_p = (pointer)&local_490;
      local_498 = 0;
      local_490._M_local_buf[0] = '\0';
      local_480 = false;
      std::__cxx11::string::_M_replace((ulong)&local_4a0,0,(char *)0x0,0x361ff2);
      local_478._M_engaged = false;
      local_6a8 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
                  &local_698;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"get_metadata","");
      local_430._0_8_ = local_430 + 0x10;
      if (local_6a8 ==
          (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)&local_698) {
        local_430._24_8_ = uStack_690;
      }
      else {
        local_430._0_4_ = local_6a8._M_payload;
        local_430[4] = local_6a8._M_engaged;
        local_430._5_3_ = local_6a8._5_3_;
      }
      local_430._8_8_ = local_6a0;
      local_6a0 = 0;
      local_698 = '\0';
      local_6a8 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
                  &local_698;
      local_430._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_430._32_8_ = pMVar7;
      *(Printer ***)(local_430._32_8_ + 8) = &local_700;
      *(undefined1 *)(local_430._32_8_ + 0x10) = 0;
      local_3f8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_430._40_8_ = 0;
      local_430._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_3f0 = '\x01';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = 0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_3e8,0,(char *)0x0,0x361ff2);
      local_380 = false;
      local_6c8._M_allocated_capacity = (size_type)&local_6b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"post_loop_handler","");
      local_378 = &local_368;
      if ((_Alloc_hider *)local_6c8._M_allocated_capacity == &local_6b8) {
        _Stack_360 = _Stack_6b0;
      }
      else {
        local_378 = (_Alloc_hider *)local_6c8._M_allocated_capacity;
      }
      local_370 = local_6c8._8_8_;
      local_6c8._8_8_ = 0;
      local_6b8._M_p._0_1_ = 0;
      local_6c8._M_allocated_capacity = (size_type)&local_6b8;
      local_358 = (undefined8 *)operator_new(0x18);
      *local_358 = pMVar7;
      local_358[1] = &local_700;
      *(undefined1 *)(local_358 + 2) = 0;
      local_340 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_350 = 0;
      local_348 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_338 = 1;
      local_330 = local_320;
      local_328 = 0;
      local_320[0] = 0;
      local_310 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_330,0,(char *)0x0,0x361ff2);
      local_2c8 = 0;
      ppiVar3 = (int **)(local_5e8 + 0x10);
      local_5e8._0_8_ = ppiVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)local_5f8 + 0x10),"message_set_definition","");
      local_2c0 = &local_2b0;
      if ((int **)local_5e8._0_8_ == ppiVar3) {
        _Stack_2a8._M_p = (pointer)local_5e8._24_8_;
      }
      else {
        local_2c0 = (int **)local_5e8._0_8_;
      }
      local_2b8 = (pointer)local_5e8._8_8_;
      local_5e8._8_8_ = (pointer)0x0;
      local_5e8[0x10] = 0;
      local_288 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_2a0 = 0;
      uStack_298 = 0;
      local_290 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_280 = 1;
      local_278 = local_268;
      local_270 = 0;
      local_268[0] = 0;
      local_258 = 0;
      local_5e8._0_8_ = ppiVar3;
      std::__cxx11::string::_M_replace((ulong)&local_278,0,(char *)0x0,0x361ff2);
      local_6f8 = &local_208;
      local_210 = 0;
      local_608._0_8_ = local_5f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"tracker_decl","");
      local_208 = local_1f8;
      if ((int *)local_608._0_8_ == local_5f8) {
        _Stack_1f0._M_p = (pointer)local_5f8._8_8_;
      }
      else {
        local_208 = (int *)local_608._0_8_;
      }
      local_200 = local_608._8_8_;
      local_608._8_8_ = 0;
      local_5f8[0]._0_1_ = '\0';
      local_608._0_8_ = local_5f8;
      local_1e8 = (undefined8 *)operator_new(0x18);
      *local_1e8 = local_6f0;
      local_1e8[1] = &local_700;
      *(undefined1 *)(local_1e8 + 2) = 0;
      local_1d0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_1e0 = 0;
      local_1d8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_1c8 = 1;
      local_1c0 = local_1b0;
      local_1b8 = 0;
      local_1b0[0] = 0;
      local_1a0 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_1c0,0,(char *)0x0,0x361ff2);
      local_158 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar4,local_4e8,5,0x9e,
                 "\n        $annotate_accessor_definition$;\n        $get_metadata$;\n        $post_loop_handler$;\n        $message_set_definition$;\n        $tracker_decl$;\n      "
                );
      lVar8 = 0x398;
      do {
        if (local_4e8[lVar8 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (auStack_530 + lVar8));
        }
        plVar1 = *(long **)((long)&local_558._M_p + lVar8);
        if ((long *)(local_548 + lVar8) != plVar1) {
          operator_delete(plVar1,*(long *)(local_548 + lVar8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)(&local_578)[lVar8 + 0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&local_580 + lVar8));
        (&local_578)[lVar8 + 0x18] = 0xff;
        if ((long *)((long)&local_5a8 + lVar8 + 0x18) != *(long **)((long)&local_5a8 + lVar8 + 8)) {
          operator_delete(*(long **)((long)&local_5a8 + lVar8 + 8),
                          *(long *)((long)&local_5a8 + lVar8 + 0x18) + 1);
        }
        lVar8 = lVar8 + -0xb8;
      } while (lVar8 != 0);
      if ((int *)local_608._0_8_ != local_5f8) {
        operator_delete((void *)local_608._0_8_,
                        CONCAT71(local_5f8._1_7_,(undefined1)local_5f8[0]) + 1);
      }
      if ((int **)local_5e8._0_8_ != ppiVar3) {
        operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
      }
      if ((_Alloc_hider *)local_6c8._M_allocated_capacity != &local_6b8) {
        operator_delete((void *)local_6c8._M_allocated_capacity,
                        CONCAT71(local_6b8._M_p._1_7_,local_6b8._M_p._0_1_) + 1);
      }
      if (local_6a8 !=
          (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)&local_698) {
        operator_delete((void *)local_6a8,CONCAT71(uStack_697,local_698) + 1);
      }
      if (local_688 != (pointer)local_678) {
        operator_delete(local_688,CONCAT71(local_678._1_7_,local_678[0]) + 1);
      }
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_130);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_118);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));

  if (IsMapEntryMessage(descriptor_)) {
    p->Emit({{"annotate_accessors",
              [&] {
                if (!options_.annotate_accessor) return;
                for (auto f : FieldRange(descriptor_)) {
                  p->Emit({{"field", FieldName(f)}},
                          R"cc(
                            volatile bool $classname$::$field$_AccessedNoStrip;
                          )cc");
                }
              }},
             {"verify",
              [&] {
                // Delegates generating verify function as only a subset of map
                // entry messages need it; i.e. UTF8 string key/value or message
                // type value.
                GenerateVerify(p);
              }},
             {"class_data", [&] { GenerateClassData(p); }}},
            R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
              $classname$::$classname$() : SuperType(_class_data_.base()) {}
              $classname$::$classname$(::$proto_ns$::Arena* arena)
                  : SuperType(arena, _class_data_.base()) {}
#else   // PROTOBUF_CUSTOM_VTABLE
              $classname$::$classname$() : SuperType() {}
              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}
#endif  // PROTOBUF_CUSTOM_VTABLE
              $annotate_accessors$;
              $verify$;
              $class_data$;
            )cc");
    parse_function_generator_->GenerateDataDefinitions(p);
    return;
  }
  if (IsAnyMessage(descriptor_)) {
    p->Emit({{"any_field_descriptor",
              [&] {
                if (!HasDescriptorMethods(descriptor_->file(), options_)) {
                  return;
                }
                p->Emit(
                    R"cc(
                      bool $classname$::GetAnyFieldDescriptors(
                          const ::$proto_ns$::Message& message,
                          const ::$proto_ns$::FieldDescriptor** type_url_field,
                          const ::$proto_ns$::FieldDescriptor** value_field) {
                        return ::_pbi::GetAnyFieldDescriptors(message, type_url_field, value_field);
                      }
                    )cc");
              }}},
            R"cc(
              $any_field_descriptor$;
              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,
                                                std::string* full_type_name) {
                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);
              }
            )cc");
  }
  p->Emit(
      {{"has_bit",
        [&] {
          if (has_bit_indices_.empty()) return;
          p->Emit(
              R"cc(
                using HasBits =
                    decltype(std::declval<$classname$>().$has_bits$);
                static constexpr ::int32_t kHasBitsOffset =
                    8 * PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_);
              )cc");
        }},
       {"oneof",
        [&] {
          if (descriptor_->real_oneof_decl_count() == 0) return;
          p->Emit(
              R"cc(
                static constexpr ::int32_t kOneofCaseOffset =
                    PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$);
              )cc");
        }},
       {"required",
        [&] {
          if (num_required_fields_ == 0) return;
          const std::vector<uint32_t> masks_for_has_bits =
              RequiredFieldsBitMask();
          p->Emit(
              {{"check_bit_mask", ConditionalToCheckBitmasks(
                                      masks_for_has_bits, false, "has_bits")}},
              R"cc(
                static bool MissingRequiredFields(const HasBits& has_bits) {
                  return $check_bit_mask$;
                }
              )cc");
        }}},
      R"cc(
        class $classname$::_Internal {
         public:
          $has_bit$;
          $oneof$;
          $required$;
        };
      )cc");
  p->Emit("\n");

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    auto v = p->WithVars(FieldVars(field, options_));
    auto t = p->WithVars(MakeTrackerCalls(field, options_));
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(p);
    if (IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, false, p);
    }
  }

  GenerateStructors(p);
  p->Emit("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(p);
    p->Emit("\n");
  }

  GenerateClassData(p);
  parse_function_generator_->GenerateDataDefinitions(p);

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(p);
    p->Emit("\n");

    GenerateSerializeWithCachedSizesToArray(p);
    p->Emit("\n");

    GenerateByteSize(p);
    p->Emit("\n");

    GenerateClassSpecificMergeImpl(p);
    p->Emit("\n");

    GenerateCopyFrom(p);
    p->Emit("\n");

    GenerateIsInitialized(p);
    p->Emit("\n");
  }

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"split_default",
              DefaultInstanceName(descriptor_, options_, /*split=*/true)},
             {"default",
              DefaultInstanceName(descriptor_, options_, /*split=*/false)}},
            R"cc(
              void $classname$::PrepareSplitMessageForWrite() {
                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {
                  void* chunk = $pbi$::CreateSplitMessageGeneric(
                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,
                      &$default$);
                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);
                }
              }
            )cc");
  }

  GenerateVerify(p);

  GenerateSwap(p);
  p->Emit("\n");

  p->Emit(
      {{"annotate_accessor_definition",
        [&] {
          if (!options_.annotate_accessor) return;
          for (auto f : FieldRange(descriptor_)) {
            p->Emit({{"field", FieldName(f)}},
                    R"cc(
                      volatile bool $classname$::$field$_AccessedNoStrip;
                    )cc");
          }
        }},
       {"get_metadata",
        [&] {
          if (!HasDescriptorMethods(descriptor_->file(), options_)) return;
          // Same as the base class, but it avoids virtual dispatch.
          p->Emit(R"cc(
            ::$proto_ns$::Metadata $classname$::GetMetadata() const {
              return $superclass$::GetMetadataImpl(GetClassData()->full());
            }
          )cc");
        }},
       {"post_loop_handler",
        [&] {
          if (!NeedsPostLoopHandler(descriptor_, options_)) return;
          p->Emit({{"required",
                    [&] {
                    }}},
                  R"cc(
                    const char* $classname$::PostLoopHandler(
                        MessageLite* msg, const char* ptr,
                        ::_pbi::ParseContext* ctx) {
                      $classname$* _this = static_cast<$classname$*>(msg);
                      $annotate_deserialize$;
                      $required$;
                      return ptr;
                    }
                  )cc");
        }},
       {"message_set_definition",
        [&] {
        }},
       {"tracker_decl",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;
          p->Emit(R"cc(
            ::$proto_ns$::AccessListener<$classtype$> $classname$::$tracker$(
                &FullMessageName);
          )cc");
        }}},
      R"cc(
        $annotate_accessor_definition$;
        $get_metadata$;
        $post_loop_handler$;
        $message_set_definition$;
        $tracker_decl$;
      )cc");
}